

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XlearnDataFree(DataHandle *out)

{
  void *pvVar1;
  ostream *poVar2;
  ostream *poVar3;
  undefined8 *in_RDI;
  runtime_error *_except_;
  DMatrix *in_stack_ffffffffffffff30;
  DMatrix *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [24];
  string *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  LogSeverity in_stack_ffffffffffffffc4;
  Logger local_14;
  undefined8 *local_10;
  
  if (in_RDI == (undefined8 *)0x0) {
    Logger::Logger(&local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/c_api/c_api.cc"
               ,(allocator *)&stack0xffffffffffffffb7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"XlearnDataFree",&local_71);
    poVar2 = Logger::Start(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/c_api/c_api.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x87);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar3 = std::operator<<(poVar2,"out");
    std::operator<<(poVar3," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    Logger::~Logger((Logger *)poVar2);
    abort();
  }
  local_10 = in_RDI;
  xLearn::DMatrix::Reset(in_stack_ffffffffffffff80);
  pvVar1 = (void *)*local_10;
  if (pvVar1 != (void *)0x0) {
    xLearn::DMatrix::~DMatrix(in_stack_ffffffffffffff30);
    operator_delete(pvVar1);
  }
  return 0;
}

Assistant:

XL_DLL int XlearnDataFree(DataHandle* out) {
  API_BEGIN();
  CHECK_NOTNULL(out);
  reinterpret_cast<xLearn::DMatrix*>(*out)->Reset();
  delete reinterpret_cast<xLearn::DMatrix*>(*out);
  API_END();
}